

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argize.c
# Opt level: O3

int argize(char *cmdline,int *argc,char **argv,size_t argvlen)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  ushort **ppuVar4;
  byte *pbVar5;
  byte *pbVar6;
  
  *argc = 0;
  bVar2 = *cmdline;
  pbVar5 = (byte *)cmdline;
  do {
    if (bVar2 == 0) {
      *cmdline = 0;
      return 0;
    }
    ppuVar4 = __ctype_b_loc();
    pbVar6 = pbVar5;
    if ((*(byte *)((long)*ppuVar4 + (ulong)bVar2 * 2 + 1) & 0x20) == 0) {
LAB_001fac28:
      iVar3 = *argc;
      if (argvlen <= (ulong)(long)iVar3) {
        return 1;
      }
      *argc = iVar3 + 1;
      argv[iVar3] = cmdline;
      bVar2 = *pbVar6;
      ppuVar4 = __ctype_b_loc();
      pbVar5 = pbVar6 + 1;
      if ((*(byte *)((long)*ppuVar4 + (ulong)bVar2 * 2 + 1) & 0x20) == 0) {
        if ((bVar2 != 0x22) && (bVar2 != 0x5c)) {
          *cmdline = bVar2;
          cmdline = (char *)((byte *)cmdline + 1);
        }
      }
      else {
        *pbVar6 = 0;
        *cmdline = 0;
        cmdline = (char *)((byte *)cmdline + 1);
      }
    }
    else {
      do {
        cmdline = (char *)((byte *)cmdline + 1);
        pbVar1 = pbVar5 + 1;
        pbVar5 = pbVar5 + 1;
      } while ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
      pbVar6 = pbVar5;
      if (*pbVar1 != 0) goto LAB_001fac28;
    }
    bVar2 = *pbVar5;
  } while( true );
}

Assistant:

int argize(char *cmdline, int *const argc, char *argv[], const size_t argvlen)
{
    char   *p, *q;
    int             state;

    p = q = cmdline;
    *argc = 0;
    state = 0;

    while (*p) {
        switch (state) {
        case 0:                                 /* skip leading white space */
            while (isspace((unsigned char)*p)) p++, q++;
            if (!*p) break;            /* If there's nothing left, get out. */
            state = 1;
            /* fall through */;

        case 1:                                                /* begin arg */
            if ((size_t)*argc < argvlen)
                argv[(*argc)++] = q;
            else
                return 1;
            state = 2;
            /* fall through */

        case 2:                            /* collect chars for current arg */
            if (isspace((unsigned char)*p))
                *q++ = *p++ = '\0', state = 0;        /* Terminate this arg */
            else if (*p == '"')
                p++, state = 3;                              /* Open quote. */
            else if (*p == '\\')
                p++, state = 4;                         /* Escape sequence. */
            else
                *q++ = *p++;                            /* Just keep going. */

            break;

        case 3:                             /* collect chars inside quotes. */
            switch (*p) {
            case '"' : p++; state = 2; break;                /* Close quote.*/
            case '\\': p++; state = 5; break;           /* Escape sequence. */
            default:   *q++ = *p++; break;
            }
            break;

        case 4:                        /* escaped character outside quotes. */
            *q++ = *p++; state = 2;
            break;

        case 5:                         /* escaped character inside quotes. */
            *q++ = *p++; state = 3;
            break;
        }
    }
    *q = '\0';
    return 0;
}